

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O2

symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_symmetric_difference_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>&>
          (symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>
          *ranges)

{
  symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>,_std::less<void>_>
  ::symmetric_difference_iterator
            (__return_storage_ptr__,*(undefined8 *)this,*(undefined8 *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

auto make_symmetric_difference_iterator (RandomAccessRange && ranges)
    {
        using std::begin;
        using std::end;
        return
            make_symmetric_difference_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges))
            );
    }